

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1147904::Target::AddBacktrace(Target *this,Value *object,cmListFileBacktrace *bt)

{
  bool bVar1;
  Value *this_00;
  Value local_50;
  UInt local_24;
  cmListFileBacktrace *pcStack_20;
  JBTIndex backtrace;
  cmListFileBacktrace *bt_local;
  Value *object_local;
  Target *this_local;
  
  pcStack_20 = bt;
  local_24 = (UInt)BacktraceData::Add(&this->Backtraces,bt);
  bVar1 = (anonymous_namespace)::JBTIndex::operator_cast_to_bool((JBTIndex *)&local_24);
  if (bVar1) {
    Json::Value::Value(&local_50,local_24);
    this_00 = Json::Value::operator[](object,"backtrace");
    Json::Value::operator=(this_00,&local_50);
    Json::Value::~Value(&local_50);
  }
  return;
}

Assistant:

void Target::AddBacktrace(Json::Value& object, cmListFileBacktrace const& bt)
{
  if (JBTIndex backtrace = this->Backtraces.Add(bt)) {
    object["backtrace"] = backtrace.Index;
  }
}